

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utlru_cache.hpp
# Opt level: O1

void __thiscall
cappuccino::utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0>::
find_range_fill<std::unordered_map<std::__cxx11::string,std::optional<unsigned_long>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<unsigned_long>>>>>
          (utlru_cache<std::__cxx11::string,unsigned_long,(cappuccino::thread_safe)0> *this,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<unsigned_long>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<unsigned_long>_>_>_>
          *key_optional_value_range,peek peek)

{
  _Hash_node_base *p_Var1;
  undefined4 uVar2;
  undefined8 in_RAX;
  time_point now;
  optional<unsigned_long> oVar3;
  undefined1 local_27 [7];
  
  now.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (p_Var1 = (key_optional_value_range->_M_h)._M_before_begin._M_nxt;
      p_Var1 != (_Hash_node_base *)0x0; p_Var1 = p_Var1->_M_nxt) {
    oVar3 = utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
            ::do_find((utlru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_(cappuccino::thread_safe)0>
                       *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (p_Var1 + 1),now,peek);
    ((_Storage<unsigned_long,_true> *)(p_Var1 + 5))->_M_value =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    *(bool *)&p_Var1[6]._M_nxt =
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_engaged;
    local_27._0_4_ = (undefined4)((ulong)in_RAX >> 8);
    uVar2 = local_27._0_4_;
    local_27._3_4_ = (undefined4)((ulong)in_RAX >> 0x20);
    *(undefined4 *)((long)&p_Var1[6]._M_nxt + 1) = uVar2;
    *(undefined4 *)((long)&p_Var1[6]._M_nxt + 4) = local_27._3_4_;
  }
  return;
}

Assistant:

auto find_range_fill(range_type& key_optional_value_range, peek peek = peek::no) -> void
    {
        auto now = std::chrono::steady_clock::now();

        std::lock_guard guard{m_lock};

        for (auto& [key, optional_value] : key_optional_value_range)
        {
            optional_value = do_find(key, now, peek);
        }
    }